

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O3

void rtosc_v2args(rtosc_arg_t *args,size_t nargs,char *arg_str,rtosc_va_list_t *ap)

{
  uint uVar1;
  uint8_t *puVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  int32_t *piVar6;
  double *pdVar7;
  undefined8 *puVar8;
  
  if (nargs != 0) {
    uVar4 = 0;
    uVar3 = 0;
    do {
      switch(*arg_str) {
      case 'b':
        uVar1 = ap->a[0].gp_offset;
        if ((ulong)uVar1 < 0x29) {
          piVar6 = (int32_t *)((ulong)uVar1 + (long)ap->a[0].reg_save_area);
          ap->a[0].gp_offset = uVar1 + 8;
        }
        else {
          piVar6 = (int32_t *)ap->a[0].overflow_arg_area;
          ap->a[0].overflow_arg_area = piVar6 + 2;
        }
        args[uVar4].i = *piVar6;
        uVar1 = ap->a[0].gp_offset;
        if ((ulong)uVar1 < 0x29) {
          puVar8 = (undefined8 *)((ulong)uVar1 + (long)ap->a[0].reg_save_area);
          ap->a[0].gp_offset = uVar1 + 8;
        }
        else {
          puVar8 = (undefined8 *)ap->a[0].overflow_arg_area;
          ap->a[0].overflow_arg_area = puVar8 + 1;
        }
        (&args->b)[uVar4].data = (uint8_t *)*puVar8;
        uVar3 = uVar3 + 1;
        break;
      case 'c':
      case 'i':
      case 'r':
        uVar1 = ap->a[0].gp_offset;
        if ((ulong)uVar1 < 0x29) {
          piVar6 = (int32_t *)((ulong)uVar1 + (long)ap->a[0].reg_save_area);
          ap->a[0].gp_offset = uVar1 + 8;
        }
        else {
          piVar6 = (int32_t *)ap->a[0].overflow_arg_area;
          ap->a[0].overflow_arg_area = piVar6 + 2;
        }
        uVar3 = uVar3 + 1;
        args[uVar4].i = *piVar6;
        break;
      case 'd':
        uVar1 = ap->a[0].fp_offset;
        if ((ulong)uVar1 < 0xa1) {
          pdVar7 = (double *)((ulong)uVar1 + (long)ap->a[0].reg_save_area);
          ap->a[0].fp_offset = uVar1 + 0x10;
        }
        else {
          pdVar7 = (double *)ap->a[0].overflow_arg_area;
          ap->a[0].overflow_arg_area = pdVar7 + 1;
        }
        uVar3 = uVar3 + 1;
        args[uVar4].d = *pdVar7;
        break;
      case 'e':
      case 'g':
      case 'j':
      case 'k':
      case 'l':
      case 'n':
      case 'o':
      case 'p':
      case 'q':
        break;
      case 'f':
        uVar1 = ap->a[0].fp_offset;
        if ((ulong)uVar1 < 0xa1) {
          pdVar7 = (double *)((ulong)uVar1 + (long)ap->a[0].reg_save_area);
          ap->a[0].fp_offset = uVar1 + 0x10;
        }
        else {
          pdVar7 = (double *)ap->a[0].overflow_arg_area;
          ap->a[0].overflow_arg_area = pdVar7 + 1;
        }
        uVar3 = uVar3 + 1;
        args[uVar4].f = (float)*pdVar7;
        break;
      case 'h':
      case 's':
      case 't':
switchD_00102a5f_caseD_68:
        uVar1 = ap->a[0].gp_offset;
        if ((ulong)uVar1 < 0x29) {
          pdVar7 = (double *)((ulong)uVar1 + (long)ap->a[0].reg_save_area);
          ap->a[0].gp_offset = uVar1 + 8;
        }
        else {
          pdVar7 = (double *)ap->a[0].overflow_arg_area;
          ap->a[0].overflow_arg_area = pdVar7 + 1;
        }
        uVar3 = uVar3 + 1;
        args[uVar4].d = *pdVar7;
        break;
      case 'm':
        uVar1 = ap->a[0].gp_offset;
        if ((ulong)uVar1 < 0x29) {
          puVar8 = (undefined8 *)((ulong)uVar1 + (long)ap->a[0].reg_save_area);
          ap->a[0].gp_offset = uVar1 + 8;
        }
        else {
          puVar8 = (undefined8 *)ap->a[0].overflow_arg_area;
          ap->a[0].overflow_arg_area = puVar8 + 1;
        }
        puVar2 = (uint8_t *)*puVar8;
        lVar5 = uVar4 * 0x10;
        args[uVar4].m[0] = *puVar2;
        args->m[lVar5 + 1] = puVar2[1];
        args->m[lVar5 + 2] = puVar2[2];
        uVar3 = uVar3 + 1;
        args->m[lVar5 + 3] = puVar2[3];
        break;
      default:
        if (*arg_str == 'S') goto switchD_00102a5f_caseD_68;
      }
      arg_str = arg_str + 1;
      uVar4 = (ulong)uVar3;
    } while (uVar4 < nargs);
  }
  return;
}

Assistant:

static void rtosc_v2args(rtosc_arg_t* args, size_t nargs, const char* arg_str,
                         rtosc_va_list_t* ap)
{
    unsigned arg_pos = 0;
    uint8_t *midi_tmp;

    while(arg_pos < nargs)
    {
        switch(*arg_str++) {
            case 'h':
            case 't':
                args[arg_pos++].h = va_arg(ap->a, int64_t);
                break;
            case 'd':
                args[arg_pos++].d = va_arg(ap->a, double);
                break;
            case 'c':
            case 'i':
            case 'r':
                args[arg_pos++].i = va_arg(ap->a, int);
                break;
            case 'm':
                midi_tmp = va_arg(ap->a, uint8_t *);
                args[arg_pos].m[0] = midi_tmp[0];
                args[arg_pos].m[1] = midi_tmp[1];
                args[arg_pos].m[2] = midi_tmp[2];
                args[arg_pos++].m[3] = midi_tmp[3];
                break;
            case 'S':
            case 's':
                args[arg_pos++].s = va_arg(ap->a, const char *);
                break;
            case 'b':
                args[arg_pos].b.len = va_arg(ap->a, int);
                args[arg_pos].b.data = va_arg(ap->a, unsigned char *);
                arg_pos++;
                break;
            case 'f':
                args[arg_pos++].f = va_arg(ap->a, double);
                break;
            default:
                ;
        }
    }
}